

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yacclab_tests.cc
# Opt level: O1

bool __thiscall
YacclabTests::SaveBroadOutputResults
          (YacclabTests *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat_<double>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat_<double>_>_>_>
          *results,string *o_filename,Mat1i *labels,
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          *filenames,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *ccl_algorithms)

{
  double dVar1;
  pointer pcVar2;
  char cVar3;
  mapped_type *pmVar4;
  ostream *poVar5;
  pointer ppVar6;
  ulong uVar7;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  *pvVar8;
  int step_number;
  key_type *pkVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  Mat1d results_reduced;
  ofstream os;
  char local_2f1;
  key_type *local_2f0;
  Size *local_2e8;
  mapped_type *local_2e0;
  Size local_2d8 [2];
  string local_2c8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  *local_2a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_2a0;
  ulong local_298;
  Mat local_290 [16];
  long local_280;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  local_2a0 = ccl_algorithms;
  std::ofstream::ofstream(&local_230,(string *)o_filename,_S_out);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 != '\0') {
    local_2a8 = filenames;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"#",1);
    local_290[0] = (Mat)0x9;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,(char *)local_290,1);
    pkVar9 = (local_2a0->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_2f0 = (local_2a0->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    if (pkVar9 != local_2f0) {
      do {
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat_<double>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat_<double>_>_>_>
                 ::at(results,pkVar9);
        cv::Mat::Mat(local_290,1,*(int *)&pmVar4->field_0xc,6);
        local_2e0 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat_<double>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat_<double>_>_>_>
                    ::at(results,pkVar9);
        local_2d8[0].width = 0;
        local_2d8[0].height = 0;
        local_2e8 = (Size *)CONCAT44(local_2e8._4_4_,0x81010006);
        local_2c8.field_2._M_allocated_capacity = 0;
        local_2c8._M_dataplus._M_p._0_4_ = 0x82010006;
        local_2c8._M_string_length = (size_type)local_290;
        cv::reduce((_InputArray *)&local_2e8,(_OutputArray *)&local_2c8,0,2,-1);
        lVar12 = 0;
        do {
          dVar1 = *(double *)(local_280 + lVar12 * 8);
          if ((dVar1 != 1.79769313486232e+308) || (NAN(dVar1))) {
            pcVar2 = (pkVar9->_M_dataplus)._M_p;
            local_2e8 = local_2d8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2e8,pcVar2,pcVar2 + pkVar9->_M_string_length);
            std::__cxx11::string::append((char *)&local_2e8);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&local_230,(char *)local_2e8,(long)local_2e0);
            Step_abi_cxx11_(&local_2c8,(StepType)lVar12);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,(char *)CONCAT44(local_2c8._M_dataplus._M_p._4_4_,
                                                        local_2c8._M_dataplus._M_p._0_4_),
                                local_2c8._M_string_length);
            local_2f1 = '\t';
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_2f1,1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_2c8._M_dataplus._M_p._4_4_,local_2c8._M_dataplus._M_p._0_4_) !=
                &local_2c8.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_2c8._M_dataplus._M_p._4_4_,
                                       local_2c8._M_dataplus._M_p._0_4_),
                              local_2c8.field_2._M_allocated_capacity + 1);
            }
            if (local_2e8 != local_2d8) {
              operator_delete(local_2e8,(long)local_2d8[0] + 1);
            }
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 != 4);
        cv::Mat::~Mat(local_290);
        pkVar9 = pkVar9 + 1;
      } while (pkVar9 != local_2f0);
    }
    local_290[0] = (Mat)0xa;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,(char *)local_290,1);
    ppVar6 = (local_2a8->
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((local_2a8->
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
        )._M_impl.super__Vector_impl_data._M_finish != ppVar6) {
      uVar11 = 0;
      pvVar8 = local_2a8;
      do {
        if (ppVar6[uVar11].second == true) {
          local_298 = uVar11;
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_230,ppVar6[uVar11].first._M_dataplus._M_p,
                              ppVar6[uVar11].first._M_string_length);
          local_290[0] = (Mat)0x9;
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_290,1);
          pkVar9 = (local_2a0->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          local_2f0 = (local_2a0->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          if (pkVar9 != local_2f0) {
            lVar12 = (long)(int)local_298;
            do {
              lVar10 = 0;
              do {
                pmVar4 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat_<double>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat_<double>_>_>_>
                         ::at(results,pkVar9);
                dVar1 = *(double *)
                         (**(long **)&pmVar4->field_0x48 * lVar12 + *(long *)&pmVar4->field_0x10 +
                         lVar10 * 8);
                if ((dVar1 != 1.79769313486232e+308) || (NAN(dVar1))) {
                  pmVar4 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat_<double>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat_<double>_>_>_>
                           ::at(results,pkVar9);
                  poVar5 = std::ostream::_M_insert<double>
                                     (*(double *)
                                       (**(long **)&pmVar4->field_0x48 * lVar12 +
                                        *(long *)&pmVar4->field_0x10 + lVar10 * 8));
                  local_290[0] = (Mat)0x9;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_290,1);
                }
                lVar10 = lVar10 + 1;
              } while (lVar10 != 4);
              pkVar9 = pkVar9 + 1;
            } while (pkVar9 != local_2f0);
          }
          local_290[0] = (Mat)0xa;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_230,(char *)local_290,1);
          pvVar8 = local_2a8;
          uVar11 = local_298;
        }
        uVar11 = (ulong)((int)uVar11 + 1);
        ppVar6 = (pvVar8->
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar7 = ((long)(pvVar8->
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar6 >> 3) *
                -0x3333333333333333;
      } while (uVar11 <= uVar7 && uVar7 - uVar11 != 0);
    }
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _operator__;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return (bool)cVar3;
}

Assistant:

bool YacclabTests::SaveBroadOutputResults(std::map<std::string, cv::Mat1d>& results, const std::string& o_filename, const cv::Mat1i& labels,
    const std::vector<std::pair<std::string, bool>>& filenames, const std::vector<std::string>& ccl_algorithms) {
    std::ofstream os(o_filename);
    if (!os.is_open()) {
        return false;
    }

    // To set heading file format
    os << "#" << '\t';
    for (const auto& algo_name : ccl_algorithms) {

        // Calculate the max of the columns to find unused steps
        cv::Mat1d results_reduced(1, results.at(algo_name).cols);
#if OPENCV_VERSION_MAJOR >= 4
        cv::reduce(results.at(algo_name), results_reduced, 0, cv::REDUCE_MAX);
#else
        cv::reduce(results.at(algo_name), results_reduced, 0, CV_REDUCE_MAX);
        cv::reduce(results.at(algo_name), results_reduced, 0, CV_REDUCE_MAX);
#endif

        for (int step_number = 0; step_number != StepType::ST_SIZE; ++step_number) {
            StepType step = static_cast<StepType>(step_number);
            double column_value(results_reduced(0, step_number));
            if (column_value != std::numeric_limits<double>::max()) {
                os << algo_name + "_" << Step(step) << '\t';
            }
        }
    }
    os << '\n';

    for (unsigned files = 0; files < filenames.size(); ++files) {
        if (filenames[files].second) {
            os << filenames[files].first << '\t';
            unsigned i = 0;
            for (const auto& algo_name : ccl_algorithms) {
                for (int step_number = 0; step_number != StepType::ST_SIZE; ++step_number) {
                    if (results.at(algo_name)(files, step_number) != std::numeric_limits<double>::max()) {
                        os << results.at(algo_name)(files, step_number) << '\t';
                    }
                    else {
                        // Step not held, skipped
                        //os << 0 << '\t';
                    }
                }
                ++i;
            }
            os << '\n';
        }
    }

    return true;
}